

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall
QPDFObjectHandle::isStreamOfType(QPDFObjectHandle *this,string *type,string *subtype)

{
  bool bVar1;
  bool local_4d;
  QPDFObjectHandle local_38;
  string *local_28;
  string *subtype_local;
  string *type_local;
  QPDFObjectHandle *this_local;
  
  local_28 = subtype;
  subtype_local = type;
  type_local = (string *)this;
  bVar1 = isStream(this);
  local_4d = false;
  if (bVar1) {
    getDict(&local_38);
    local_4d = isDictionaryOfType(&local_38,subtype_local,local_28);
  }
  this_local._7_1_ = local_4d;
  if (bVar1) {
    ~QPDFObjectHandle(&local_38);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFObjectHandle::isStreamOfType(std::string const& type, std::string const& subtype) const
{
    return isStream() && getDict().isDictionaryOfType(type, subtype);
}